

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

QStringList * __thiscall
QCommandLineParser::unknownOptionNames(QStringList *__return_storage_ptr__,QCommandLineParser *this)

{
  QCommandLineParserPrivate::checkParsed(this->d,"unknownOptionNames");
  QArrayDataPointer<QString>::QArrayDataPointer
            (&__return_storage_ptr__->d,&(this->d->unknownOptionNames).d);
  return __return_storage_ptr__;
}

Assistant:

QStringList QCommandLineParser::unknownOptionNames() const
{
    d->checkParsed("unknownOptionNames");
    return d->unknownOptionNames;
}